

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::SSBMemberOffsetAndAlignTest::getVerificationSnippet_abi_cxx11_
          (string *__return_storage_ptr__,SSBMemberOffsetAndAlignTest *this,GLuint param_1,
          ProgramInterface *param_2,STAGES stage)

{
  GLchar *text;
  GLchar *prefix;
  allocator<char> local_2e;
  undefined1 local_2d;
  STAGES local_2c;
  ProgramInterface *pPStack_28;
  STAGES stage_local;
  ProgramInterface *param_2_local;
  SSBMemberOffsetAndAlignTest *pSStack_18;
  GLuint param_1_local;
  SSBMemberOffsetAndAlignTest *this_local;
  string *verification;
  
  local_2d = 0;
  local_2c = stage;
  pPStack_28 = param_2;
  param_2_local._4_4_ = param_1;
  pSStack_18 = this;
  this_local = (SSBMemberOffsetAndAlignTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "if ( (PREFIXblock.at_first_offset  != PREFIXblock.at_eigth_offset   ) ||\n         (PREFIXblock.at_second_offset != PREFIXblock.at_sixth_offset[1]) ||\n         (PREFIXblock.at_third_offset  != PREFIXblock.at_sixth_offset[0]) ||\n         (PREFIXblock.at_fourth_offset != PREFIXblock.at_fifth_offset   )  )\n    {\n        result = 0;\n    }"
             ,&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  text = Utils::ProgramInterface::GetStagePrefix(local_2c,SSB);
  Utils::replaceAllTokens("PREFIX",text,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SSBMemberOffsetAndAlignTest::getVerificationSnippet(GLuint /* test_case_index */,
																Utils::ProgramInterface& /* program_interface */,
																Utils::Shader::STAGES stage)
{
	std::string verification = "if ( (PREFIXblock.at_first_offset  != PREFIXblock.at_eigth_offset   ) ||\n"
							   "         (PREFIXblock.at_second_offset != PREFIXblock.at_sixth_offset[1]) ||\n"
							   "         (PREFIXblock.at_third_offset  != PREFIXblock.at_sixth_offset[0]) ||\n"
							   "         (PREFIXblock.at_fourth_offset != PREFIXblock.at_fifth_offset   )  )\n"
							   "    {\n"
							   "        result = 0;\n"
							   "    }";

	const GLchar* prefix = Utils::ProgramInterface::GetStagePrefix(stage, Utils::Variable::SSB);

	Utils::replaceAllTokens("PREFIX", prefix, verification);

	return verification;
}